

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

int Gia_ManSimPatHashPatterns(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int *pnC0,int *pnC1)

{
  word **__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Mem_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar4;
  word *pIn1;
  word *pwVar5;
  int *piVar6;
  uint uVar7;
  long lVar8;
  int i;
  ulong uVar9;
  int v;
  bool bVar10;
  ulong local_b0;
  int local_a4;
  word **local_80;
  
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = nWords;
  p_00->LogPageSze = 0xc;
  p_00->PageMask = 0xfff;
  p_00->iPage = -1;
  iVar2 = Abc_PrimeCudd(0x1000);
  p_01 = Vec_IntAlloc(iVar2);
  p_01->nSize = iVar2;
  if (p_01->pArray != (int *)0x0) {
    memset(p_01->pArray,0xff,(long)iVar2 << 2);
  }
  p_00->vTable = p_01;
  p_02 = Vec_IntAlloc(0x1000);
  p_00->vNexts = p_02;
  local_80 = (word **)0x0;
  iVar2 = 0;
  local_a4 = -1;
  local_b0 = 0;
  v = 0;
  do {
    i = (int)local_b0;
    if ((p->nObjs <= v) || (pGVar4 = Gia_ManObj(p,v), pGVar4 == (Gia_Obj_t *)0x0)) {
      Vec_IntFreeP(&p_00->vTable);
      Vec_IntFreeP(&p_00->vNexts);
      iVar2 = -1;
      if (-1 < p_00->iPage) {
        iVar2 = p_00->iPage;
      }
      __ptr = p_00->ppPages;
      for (lVar8 = 0; (long)iVar2 + 1 != lVar8; lVar8 = lVar8 + 1) {
        if (__ptr[lVar8] != (word *)0x0) {
          free(__ptr[lVar8]);
          __ptr[lVar8] = (word *)0x0;
        }
      }
      free(__ptr);
      free(p_00);
      return i;
    }
    uVar7 = ~*(uint *)pGVar4;
    if (((uVar7 & 0x9fffffff) == 0) || (-1 < (int)*(uint *)pGVar4 && (uVar7 & 0x1fffffff) != 0)) {
      pIn1 = Vec_WrdEntryP(vSims,v * nWords);
      if ((pnC0 != (int *)0x0) && (iVar3 = Abc_TtIsConst0(pIn1,nWords), iVar3 != 0)) {
        *pnC0 = *pnC0 + 1;
      }
      if ((pnC1 != (int *)0x0) && (iVar3 = Abc_TtIsConst1(pIn1,nWords), iVar3 != 0)) {
        *pnC1 = *pnC1 + 1;
      }
      if (p_01->nSize < i) {
        iVar3 = Abc_PrimeCudd(p_01->nSize * 2);
        Vec_IntFill(p_01,iVar3,-1);
        p_02->nSize = 0;
        uVar9 = 0;
        iVar3 = 0;
        if (0 < i) {
          uVar9 = local_b0;
          iVar3 = 0;
        }
        while (((int)uVar9 != iVar3 &&
               (pwVar5 = Vec_MemReadEntry(p_00,iVar3), pwVar5 != (word *)0x0))) {
          piVar6 = Vec_MemHashLookup(p_00,pwVar5);
          if (*piVar6 != -1) {
            __assert_fail("*pSpot == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                          ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
          }
          *piVar6 = p_02->nSize;
          Vec_IntPush(p_02,-1);
          iVar3 = iVar3 + 1;
        }
        if (i != p_02->nSize) {
          __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                        ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
        }
      }
      piVar6 = Vec_MemHashLookup(p_00,pIn1);
      if (*piVar6 == -1) {
        *piVar6 = p_02->nSize;
        Vec_IntPush(p_02,-1);
        if (i < 0) {
          __assert_fail("i >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                        ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
        }
        iVar3 = (int)(local_b0 >> 0xc);
        if (local_a4 < iVar3) {
          if (iVar2 <= iVar3) {
            iVar1 = iVar2 * 2;
            bVar10 = iVar2 != 0;
            iVar2 = iVar3 + 0x20;
            if (bVar10) {
              iVar2 = iVar1;
            }
            p_00->nPageAlloc = iVar2;
            if (local_80 == (word **)0x0) {
              local_80 = (word **)malloc((long)iVar2 * 8);
            }
            else {
              local_80 = (word **)realloc(local_80,(long)iVar2 * 8);
            }
            p_00->ppPages = local_80;
          }
          for (lVar8 = (long)local_a4; lVar8 < (long)(local_b0 >> 0xc); lVar8 = lVar8 + 1) {
            pwVar5 = (word *)malloc((long)(nWords << 0xc) << 3);
            local_80[lVar8 + 1] = pwVar5;
          }
          p_00->iPage = iVar3;
          local_a4 = iVar3;
        }
        uVar7 = i + 1;
        p_00->nEntries = uVar7;
        pwVar5 = Vec_MemReadEntry(p_00,i);
        memmove(pwVar5,pIn1,(long)nWords << 3);
        local_b0 = (ulong)uVar7;
        if (uVar7 != p_02->nSize) {
          __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                        ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
        }
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

int Gia_ManSimPatHashPatterns( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int * pnC0, int * pnC1 )
{
    Gia_Obj_t * pObj; 
    int i, nUnique;
    Vec_Mem_t * vStore;
    vStore = Vec_MemAlloc( nWords, 12 ); // 2^12 N-word entries per page
    Vec_MemHashAlloc( vStore, 1 << 12 );
    Gia_ManForEachCand( p, pObj, i )
    {
        word * pSim = Vec_WrdEntryP(vSims, i*nWords);
        if ( pnC0 && Abc_TtIsConst0(pSim, nWords) )
            (*pnC0)++;
        if ( pnC1 && Abc_TtIsConst1(pSim, nWords) )
            (*pnC1)++;
        Vec_MemHashInsert( vStore, pSim );
    }
    nUnique = Vec_MemEntryNum( vStore );
    Vec_MemHashFree( vStore );
    Vec_MemFree( vStore );
    return nUnique;
}